

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O3

void grd_spdopsi(grd_st_t *grd_st,seq_t *seq)

{
  uint uVar1;
  uint uVar2;
  mdl_t *pmVar3;
  double *r;
  double *r_00;
  double *pdVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t N;
  ulong uVar15;
  double dVar16;
  
  pmVar3 = grd_st->mdl;
  r = grd_st->psi;
  uVar1 = pmVar3->nlbl;
  uVar9 = (ulong)uVar1;
  uVar14 = seq->len;
  uVar10 = (ulong)uVar14;
  r_00 = grd_st->psiuni;
  if (uVar10 != 0) {
    pdVar4 = pmVar3->theta;
    puVar5 = grd_st->psiyp;
    puVar6 = grd_st->psiidx;
    puVar7 = grd_st->psioff;
    uVar8 = 0;
    do {
      if (uVar9 != 0) {
        uVar2 = *(uint *)&seq[uVar8 * 2 + 1].field_0x4;
        uVar15 = 0;
        do {
          if ((ulong)uVar2 == 0) {
            dVar16 = 0.0;
          }
          else {
            dVar16 = 0.0;
            uVar13 = 0;
            do {
              dVar16 = dVar16 + pdVar4[uVar15 + pmVar3->uoff
                                                [*(long *)(*(long *)(seq + uVar8 * 2 + 2) +
                                                          uVar13 * 8)]];
              uVar13 = uVar13 + 1;
            } while (uVar2 != uVar13);
          }
          r_00[uVar8 * uVar9 + uVar15] = dVar16;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar10);
    if (uVar14 != 1) {
      uVar14 = 0;
      uVar8 = 1;
      do {
        puVar7[uVar8] = uVar14;
        if (uVar1 != 0) {
          uVar15 = 0;
          uVar12 = 0;
          do {
            uVar13 = 0;
            do {
              if ((ulong)*(uint *)&seq[uVar8 * 2 + 1].raw != 0) {
                dVar16 = 0.0;
                uVar11 = 0;
                do {
                  dVar16 = dVar16 + pdVar4[uVar15 + (ulong)(uVar1 * (uint32_t)uVar13) +
                                                    pmVar3->boff[seq[uVar8 * 2 + 2].raw[uVar11]]];
                  uVar11 = uVar11 + 1;
                } while (*(uint *)&seq[uVar8 * 2 + 1].raw != uVar11);
                if ((dVar16 != 0.0) || (NAN(dVar16))) {
                  puVar5[uVar14] = (uint32_t)uVar13;
                  r[uVar14] = dVar16;
                  uVar12 = uVar12 + 1;
                  uVar14 = uVar14 + 1;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar9);
            puVar6[uVar8 * uVar9 + uVar15] = uVar12;
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar9);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar10);
      N = (uint64_t)uVar14;
      goto LAB_00108b08;
    }
  }
  N = 0;
LAB_00108b08:
  xvm_expma(r_00,r_00,0.0,uVar10 * uVar9);
  xvm_expma(r,r,1.0,N);
  return;
}

Assistant:

void grd_spdopsi(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const double  *x = mdl->theta;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   (*psiuni)[T][Y] = (void *)grd_st->psiuni;
	double    *psival        =         grd_st->psi;
	uint32_t  *psiyp         =         grd_st->psiyp;
	uint32_t (*psiidx)[T][Y] = (void *)grd_st->psiidx;
	uint32_t  *psioff        =         grd_st->psioff;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double sum = 0.0;
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				sum += x[mdl->uoff[o] + y];
			}
			(*psiuni)[t][y] = sum;
		}
	}
	uint32_t off = 0;
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		psioff[t] = off;
		for (uint32_t y = 0, nnz = 0; y < Y; y++) {
			for (uint32_t yp = 0; yp < Y; yp++) {
				double sum = 0.0;
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					sum += x[mdl->boff[o] + yp * Y + y];
				}
				if (sum == 0.0)
					continue;
				psiyp [off] = yp;
				psival[off] = sum;
				nnz++, off++;
			}
			(*psiidx)[t][y] = nnz;
		}
	}
	xvm_expma((double *)psiuni, (double *)psiuni, 0.0, (uint64_t)T * Y);
	xvm_expma((double *)psival, (double *)psival, 1.0, off);
}